

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_line_ended_undo(Parser *this)

{
  code *pcVar1;
  long lVar2;
  bool bVar3;
  error_flags eVar4;
  long *plVar5;
  long in_RDI;
  ro_substr rVar6;
  char msg_3 [125];
  size_t delta;
  char msg_2 [109];
  char msg_1 [39];
  char msg [39];
  size_t rnum;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  char *in_stack_fffffffffffffca8;
  Location *in_stack_fffffffffffffcb0;
  ulong local_340;
  char *local_2b0;
  size_t local_2a8;
  undefined4 uStack_288;
  undefined4 uStack_284;
  char *local_280;
  undefined1 local_278 [128];
  long local_1f8;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  char *local_1d0;
  undefined1 local_1c8 [128];
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  char *local_130;
  undefined1 local_128 [48];
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  char *local_e0;
  undefined1 local_d8 [56];
  char *local_a0;
  undefined4 local_98;
  ulong local_90;
  long *local_88;
  char *local_80;
  undefined4 local_78;
  ulong local_70;
  long *local_68;
  char *local_60;
  undefined4 local_58;
  ulong local_50;
  char *local_48;
  undefined4 local_40;
  char *local_38;
  undefined4 local_30;
  ulong local_28;
  ulong local_20;
  long local_18;
  
  if (*(long *)(*(long *)(in_RDI + 0x9f0) + 0x40) != 1) {
    memcpy(local_d8,"check failed: (m_state->pos.col == 1u)",0x27);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                       CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                       CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    (*pcVar1)(local_d8,0x27,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffc90 = uStack_f8;
    in_stack_fffffffffffffc94 = uStack_f4;
    in_stack_fffffffffffffc98 = local_f0;
    in_stack_fffffffffffffc9c = uStack_ec;
    in_stack_fffffffffffffca0 = uStack_e8;
    in_stack_fffffffffffffca4 = uStack_e4;
    in_stack_fffffffffffffca8 = local_e0;
  }
  if (*(long *)(*(long *)(in_RDI + 0x9f0) + 0x38) == 0) {
    memcpy(local_128,"check failed: (m_state->pos.line > 0u)",0x27);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                       CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                       CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    (*pcVar1)(local_128,0x27,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffc90 = uStack_148;
    in_stack_fffffffffffffc94 = uStack_144;
    in_stack_fffffffffffffc98 = local_140;
    in_stack_fffffffffffffc9c = uStack_13c;
    in_stack_fffffffffffffca0 = uStack_138;
    in_stack_fffffffffffffca4 = uStack_134;
    in_stack_fffffffffffffca8 = local_130;
  }
  if (*(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x30) <
      (ulong)(*(long *)(*(long *)(in_RDI + 0x9f0) + 0x60) -
             *(long *)(*(long *)(in_RDI + 0x9f0) + 0x70))) {
    memcpy(local_1c8,
           "check failed: (m_state->pos.offset >= m_state->line_contents.full.len - m_state->line_contents.stripped.len)"
           ,0x6d);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                       CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                       CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    (*pcVar1)(local_1c8,0x6d,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffc90 = uStack_1e8;
    in_stack_fffffffffffffc94 = uStack_1e4;
    in_stack_fffffffffffffc98 = local_1e0;
    in_stack_fffffffffffffc9c = uStack_1dc;
    in_stack_fffffffffffffca0 = uStack_1d8;
    in_stack_fffffffffffffca4 = uStack_1d4;
    in_stack_fffffffffffffca8 = local_1d0;
  }
  local_1f8 = *(long *)(*(long *)(in_RDI + 0x9f0) + 0x60) -
              *(long *)(*(long *)(in_RDI + 0x9f0) + 0x70);
  *(long *)(*(long *)(in_RDI + 0x9f0) + 0x30) =
       *(long *)(*(long *)(in_RDI + 0x9f0) + 0x30) - local_1f8;
  *(long *)(*(long *)(in_RDI + 0x9f0) + 0x38) = *(long *)(*(long *)(in_RDI + 0x9f0) + 0x38) + -1;
  *(long *)(*(long *)(in_RDI + 0x9f0) + 0x40) = *(long *)(*(long *)(in_RDI + 0x9f0) + 0x70) + 1;
  if (*(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x30) < *(ulong *)(in_RDI + 0x20)) {
    plVar5 = (long *)(in_RDI + 0x18);
    local_70 = *(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x30);
    local_68 = plVar5;
    if (*(ulong *)(in_RDI + 0x20) <= local_70) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        trap_instruction();
      }
      local_80 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_78 = 0x14c3;
      handle_error(0x344e8b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
    }
    if (*(char *)(*plVar5 + local_70) != '\n') {
      plVar5 = (long *)(in_RDI + 0x18);
      local_90 = *(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x30);
      local_88 = plVar5;
      if (*(ulong *)(in_RDI + 0x20) <= local_90) {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          trap_instruction();
        }
        local_a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_98 = 0x14c3;
        handle_error(0x344e8b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      if (*(char *)(*plVar5 + local_90) != '\r') {
        memcpy(local_278,
               "check failed: (m_state->pos.offset >= m_buf.len || m_buf[m_state->pos.offset] == \'\\n\' || m_buf[m_state->pos.offset] == \'\\r\')"
               ,0x7d);
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          trap_instruction();
        }
        pcVar1 = *(code **)(in_RDI + 0x9e8);
        Location::Location(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                           CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                           CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
        (*pcVar1)(local_278,0x7d,*(undefined8 *)(in_RDI + 0x9d0));
        in_stack_fffffffffffffca0 = uStack_288;
        in_stack_fffffffffffffca4 = uStack_284;
        in_stack_fffffffffffffca8 = local_280;
      }
    }
  }
  local_18 = in_RDI + 0x18;
  local_20 = *(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x30);
  local_28 = 0;
  if (*(ulong *)(in_RDI + 0x20) < local_20) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    local_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_30 = 0x153a;
    handle_error(0x344e8b,(char *)0x153a,"check failed: %s","first >= 0 && first <= len");
  }
  if (*(ulong *)(in_RDI + 0x20) < local_28 && local_28 != 0xffffffffffffffff) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_40 = 0x153b;
    handle_error(0x344e8b,(char *)0x153b,"check failed: %s",
                 "(num >= 0 && num <= len) || (num == npos)");
  }
  if (local_28 == 0xffffffffffffffff) {
    local_340 = *(long *)(in_RDI + 0x20) - local_20;
  }
  else {
    local_340 = local_28;
  }
  local_50 = local_340;
  if (*(ulong *)(in_RDI + 0x20) < local_20 + local_340 && local_28 != 0) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_58 = 0x153d;
    handle_error(0x344e8b,(char *)0x153d,"check failed: %s",
                 "(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<char>::basic_substring
            ((basic_substring<char> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  rVar6 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x316bb4);
  lVar2 = *(long *)(in_RDI + 0x9f0);
  local_2b0 = rVar6.str;
  *(char **)(lVar2 + 0x78) = local_2b0;
  local_2a8 = rVar6.len;
  *(size_t *)(lVar2 + 0x80) = local_2a8;
  return;
}

Assistant:

void Parser::_line_ended_undo()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.col == 1u);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.line > 0u);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= m_state->line_contents.full.len - m_state->line_contents.stripped.len);
    size_t delta = m_state->line_contents.full.len - m_state->line_contents.stripped.len;
    _c4dbgpf("line[{}] undo ended! line {}-->{}, offset {}-->{}", m_state->pos.line, m_state->pos.line, m_state->pos.line - 1, m_state->pos.offset, m_state->pos.offset - delta);
    m_state->pos.offset -= delta;
    --m_state->pos.line;
    m_state->pos.col = m_state->line_contents.stripped.len + 1u;
    // don't forget to undo also the changes to the remainder of the line
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= m_buf.len || m_buf[m_state->pos.offset] == '\n' || m_buf[m_state->pos.offset] == '\r');
    m_state->line_contents.rem = m_buf.sub(m_state->pos.offset, 0);
}